

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomprops.c
# Opt level: O0

int fixAtomName(char *atomname,char *resname,int position)

{
  int iVar1;
  char *pcVar2;
  int local_34;
  char acStack_2f [3];
  int i;
  char name [5];
  char resn [6];
  int position_local;
  char *resname_local;
  char *atomname_local;
  
  _acStack_2f = 0x20202020;
  i._1_1_ = 0;
  unique0x100001be = position;
  sprintf((char *)((long)&i + 2),":%-3.3s:",resname);
  for (local_34 = 0; (local_34 < 4 && (atomname[local_34] != '\0')); local_34 = local_34 + 1) {
    iVar1 = toupper((int)atomname[local_34]);
    acStack_2f[local_34] = (char)iVar1;
  }
  acStack_2f[local_34] = '\0';
  switch(acStack_2f[stack0xffffffffffffffdc]) {
  case 'E':
    pcVar2 = strstr("currently there are none RMI 070711",(char *)((long)&i + 2));
    if (pcVar2 != (char *)0x0) {
      return 1;
    }
    break;
  case 'F':
    break;
  case 'G':
    goto switchD_00120ea7_caseD_47;
  default:
    goto LAB_00120f53;
  case 'O':
    goto switchD_00120ea7_caseD_4f;
  case 'S':
    goto switchD_00120ea7_caseD_53;
  }
  pcVar2 = strstr(":PHF:HF3:HF5:",(char *)((long)&i + 2));
  if (pcVar2 == (char *)0x0) {
switchD_00120ea7_caseD_47:
    pcVar2 = strstr(": HG:HG2:HGB:HGC:HGI:MAC:MBO:MMC:PHG:PMB:AAS:AMS:BE7:CMH:EMC:EMT:",
                    (char *)((long)&i + 2));
    if (pcVar2 == (char *)0x0) {
switchD_00120ea7_caseD_4f:
      pcVar2 = strstr(": HO:HO3:",(char *)((long)&i + 2));
      if (pcVar2 == (char *)0x0) {
switchD_00120ea7_caseD_53:
        pcVar2 = strstr("currently there are none RMI 070711",(char *)((long)&i + 2));
        if (pcVar2 == (char *)0x0) {
LAB_00120f53:
          atomname_local._4_4_ = 0;
        }
        else {
          atomname_local._4_4_ = 1;
        }
      }
      else {
        atomname_local._4_4_ = 1;
      }
    }
    else {
      atomname_local._4_4_ = 1;
    }
  }
  else {
    atomname_local._4_4_ = 1;
  }
  return atomname_local._4_4_;
}

Assistant:

int fixAtomName(const char* atomname, char resname[], int position) { /* no bool in C */
   char resn[6];
   char name[5] = "    ";
   int i;
   sprintf(resn, ":%-3.3s:", resname);
   for (i = 0; i < 4; i++) { /* uppercase the input */
      if (atomname[i] == '\0') { break; }
      name[i] = toupper(atomname[i]);
   }
   name[i] = '\0';
        switch(name[position]) {
           case 'E': if (strstr(HE_RESNAMES, resn) != NULL) { return 1; }
           case 'F': if (strstr(HF_RESNAMES, resn) != NULL) { return 1; }
           case 'G': if (strstr(HG_RESNAMES, resn) != NULL) { return 1; }
           case 'O': if (strstr(HO_RESNAMES, resn) != NULL) { return 1; }
           case 'S': if (strstr(HS_RESNAMES, resn) != NULL) { return 1; }
           default: break;
	}
   return 0;
}